

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O3

bool anon_unknown.dwarf_531f6::EndsWith(string *input,string *needle)

{
  int iVar1;
  bool bVar2;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  if (input->_M_string_length < needle->_M_string_length) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)input);
    if (local_30 == needle->_M_string_length) {
      if (local_30 == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_38,(needle->_M_dataplus)._M_p,local_30);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  return bVar2;
}

Assistant:

bool EndsWith(const string& input, const string& needle) {
  return (input.size() >= needle.size() &&
          input.substr(input.size() - needle.size()) == needle);
}